

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subset_info_annex_imgui.h
# Opt level: O1

void lumeview::SubsetInfoAnnex_ImGui(SubsetInfoAnnex *sia)

{
  pointer ptr_id;
  float fVar1;
  float fVar2;
  bool bVar3;
  pointer pSVar4;
  bool bVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  SubsetInfoAnnex *in_RDI;
  Color *col;
  bool *v;
  bool local_4e;
  bool local_4d;
  uint local_4c;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  SubsetInfoAnnex *local_38;
  
  uVar7 = (int)((ulong)((long)(in_RDI->m_subsetProps).
                              super__Vector_base<lume::SubsetInfoAnnex::SubsetProperties,_std::allocator<lume::SubsetInfoAnnex::SubsetProperties>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(in_RDI->m_subsetProps).
                             super__Vector_base<lume::SubsetInfoAnnex::SubsetProperties,_std::allocator<lume::SubsetInfoAnnex::SubsetProperties>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x49249249;
  local_38 = in_RDI;
  if (uVar7 != 0) {
    ImGui::NewLine();
    ImGui::SameLine(60.0,-1.0);
    ImGui::Text("name");
    ImGui::SameLine(160.0,-1.0);
    ImGui::Text("color");
    ImGui::SameLine(210.0,-1.0);
    ImGui::Text("visible");
    ImGui::Separator();
  }
  local_4c = 0;
  if (uVar7 != 0) {
    do {
      uVar8 = (ulong)local_4c;
      pSVar4 = (local_38->m_subsetProps).
               super__Vector_base<lume::SubsetInfoAnnex::SubsetProperties,_std::allocator<lume::SubsetInfoAnnex::SubsetProperties>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar6 = ((long)(local_38->m_subsetProps).
                     super__Vector_base<lume::SubsetInfoAnnex::SubsetProperties,_std::allocator<lume::SubsetInfoAnnex::SubsetProperties>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar4 >> 3) *
              0x6db6db6db6db6db7;
      if (uVar6 < uVar8 || uVar6 - uVar8 == 0) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
      }
      ptr_id = pSVar4 + uVar8;
      col = &pSVar4[uVar8].color;
      local_3c = col->m_data[0];
      local_40 = pSVar4[uVar8].color.m_data[1];
      local_44 = pSVar4[uVar8].color.m_data[2];
      local_48 = pSVar4[uVar8].color.m_data[3];
      v = &pSVar4[uVar8].visible;
      bVar3 = *v;
      ImGui::PushID(ptr_id);
      ImGui::AlignTextToFramePadding();
      ImGui::Text("%d:",(ulong)local_4c);
      ImGui::SameLine(60.0,-1.0);
      ImGui::Text(pSVar4[uVar8].name._M_dataplus._M_p);
      ImGui::SameLine(160.0,-1.0);
      ImGui::ColorEdit4("",col->m_data,0x20);
      ImGui::SameLine(210.0,-1.0);
      ImGui::Checkbox("",v);
      if (local_4c + 1 != uVar7) {
        ImGui::Separator();
      }
      ImGui::PopID();
      fVar1 = col->m_data[0];
      if (((((fVar1 != local_3c) || (NAN(fVar1) || NAN(local_3c))) ||
           (fVar2 = (ptr_id->color).m_data[1], fVar2 != local_40)) ||
          ((NAN(fVar2) || NAN(local_40) || (fVar2 = (ptr_id->color).m_data[2], fVar2 != local_44))))
         || (NAN(fVar2) || NAN(local_44))) {
        bVar5 = false;
      }
      else {
        bVar5 = (ptr_id->color).m_data[3] == local_48;
      }
      if ((!bVar5) || (*v != bVar3)) {
        local_4d = true;
        if ((fVar1 == local_3c) && (!NAN(fVar1) && !NAN(local_3c))) {
          fVar1 = (ptr_id->color).m_data[1];
          if ((fVar1 == local_40) && (!NAN(fVar1) && !NAN(local_40))) {
            fVar1 = (ptr_id->color).m_data[2];
            if ((fVar1 == local_44) && (!NAN(fVar1) && !NAN(local_44))) {
              local_4d = (bool)(-(local_48 != (ptr_id->color).m_data[3]) & 1);
            }
          }
        }
        local_4e = *v != bVar3;
        MessageQueue::
        post<lumeview::SubsetInfoAnnexMessage,lume::SubsetInfoAnnex*&,unsigned_int&,bool,bool>
                  (&local_38,&local_4c,&local_4d,&local_4e);
      }
      local_4c = local_4c + 1;
    } while (local_4c < uVar7);
  }
  return;
}

Assistant:

inline void SubsetInfoAnnex_ImGui (lume::SubsetInfoAnnex* sia)
{
	using namespace lume;

	const index_t numSubs = sia->num_subset_properties ();

	
	if (numSubs > 0) {
		ImGui::NewLine ();
		ImGui::SameLine (60);
		ImGui::Text ("name");
		ImGui::SameLine (160);
		ImGui::Text ("color");
		ImGui::SameLine (210);
		ImGui::Text ("visible");
		ImGui::Separator();
	}

	for(index_t isub = 0; isub < numSubs; ++isub) {
		SubsetInfoAnnex::SubsetProperties& prop = sia->subset_properties (isub);
		auto oldColor = prop.color;
		bool oldVisible = prop.visible;

		ImGui::PushID(&prop);
		ImGui::AlignTextToFramePadding();
	    ImGui::Text("%d:", isub);
	    ImGui::SameLine(60);
	    ImGui::Text(prop.name.c_str());
		ImGui::SameLine(160);
		ImGui::ColorEdit4("", prop.color.data_ptr(), ImGuiColorEditFlags_NoInputs);
		ImGui::SameLine(210);
		ImGui::Checkbox ("", &prop.visible);

		if (isub + 1 != numSubs)
			ImGui::Separator();

		ImGui::PopID();

		if (prop.color != oldColor || prop.visible != oldVisible) {
			MessageQueue::post <SubsetInfoAnnexMessage> (
					sia,
					isub,
					prop.color != oldColor,
					prop.visible != oldVisible);
		}
	}
}